

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::maybe::name_abi_cxx11_(maybe *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [2];
  
  __lhs = local_50;
  scanner_storage::name_abi_cxx11_((scanner_storage *)__lhs);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return (string *)in_RDI;
}

Assistant:

TOML11_INLINE std::string maybe::name() const
{
    return "maybe{" + other_.name() + "}";
}